

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::SourceClip::SourceClip(SourceClip *this,Dictionary *d)

{
  byte_t *value;
  UL local_48;
  Dictionary *local_18;
  Dictionary *d_local;
  SourceClip *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  StructuralComponent::StructuralComponent(&this->super_StructuralComponent,d);
  (this->super_StructuralComponent).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__SourceClip_0033a3d8;
  this->StartPosition = 0;
  UMID::UMID(&this->SourcePackageID);
  this->SourceTrackID = 0;
  if ((this->super_StructuralComponent).super_InterchangeObject.m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_StructuralComponent).super_InterchangeObject.m_Dict,
                           MDD_SourceClip);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_StructuralComponent).super_InterchangeObject.super_KLVPacket.m_UL,
                  &local_48);
    UL::~UL(&local_48);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x460,"ASDCP::MXF::SourceClip::SourceClip(const Dictionary *)");
}

Assistant:

SourceClip::SourceClip(const Dictionary* d) : StructuralComponent(d), StartPosition(0), SourceTrackID(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_SourceClip);
}